

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pogg-http.c
# Opt level: O0

int pogg_mainloop(http_server_t *server,char *filename,int quiet)

{
  unsigned_long uVar1;
  __time_t _Var2;
  int iVar3;
  unsigned_long uVar4;
  long lVar5;
  int iVar6;
  float local_10e8;
  float local_10cc;
  float local_1098;
  unsigned_long len;
  int ret;
  int i;
  unsigned_long start_usec;
  unsigned_long start_sec;
  timeval tv;
  ogg_page_t page;
  unsigned_long last_time;
  unsigned_long page_time;
  vorbis_stream_t vorbis;
  int quiet_local;
  char *filename_local;
  http_server_t *server_local;
  
  vorbis._3788_4_ = quiet;
  vorbis_stream_init((vorbis_stream_t *)&page_time);
  iVar3 = file_open_read((file_t *)&vorbis.blocksize_0,filename);
  if ((iVar3 == 0) || (iVar3 = vorbis_stream_read_hdrs((vorbis_stream_t *)&page_time), iVar3 == 0))
  {
    fprintf(_stderr,"Could not open ogg file: %s\n",filename);
    vorbis_stream_destroy((vorbis_stream_t *)&page_time);
    server_local._4_4_ = 0;
  }
  else {
    if (vorbis._3788_4_ == 0) {
      fprintf(_stderr,"\rStreaming %s...\n",filename);
    }
    last_time = 0;
    ogg_page_init((ogg_page_t *)&tv.tv_usec);
    while (iVar3 = ogg_next_page((file_t *)&vorbis.blocksize_0,(ogg_page_t *)&tv.tv_usec),
          -1 < iVar3 && finished == 0) {
      gettimeofday((timeval *)&start_sec,(__timezone_ptr_t)0x0);
      _Var2 = tv.tv_sec;
      uVar1 = start_sec;
      iVar3 = http_server_main(server,&page_time);
      if (iVar3 == 0) {
        fprintf(_stderr,"Http main error\n");
        file_close((file_t *)&vorbis.blocksize_0);
        vorbis_stream_destroy((vorbis_stream_t *)&page_time);
        ogg_page_destroy((ogg_page_t *)&tv.tv_usec);
        return 0;
      }
      for (len._4_4_ = 0; len._4_4_ < server->num_clients; len._4_4_ = len._4_4_ + 1) {
        if (((server->clients[(int)len._4_4_].fd != -1) &&
            (1 < server->clients[(int)len._4_4_].found)) &&
           (iVar3 = unix_write(server->clients[(int)len._4_4_].fd,(uchar *)page.size,
                               page.lacing_values._247_8_),
           (long)iVar3 != page.lacing_values._247_8_)) {
          fprintf(_stderr,"Error writing to client %d\n",(ulong)len._4_4_);
          http_client_close(server,server->clients + (int)len._4_4_);
        }
      }
      uVar4 = ogg_position_to_msecs((ogg_page_t *)&tv.tv_usec,vorbis._3368_8_);
      pogg_mainloop::wait_time = (uVar4 - last_time) + pogg_mainloop::wait_time;
      if (200 < pogg_mainloop::wait_time) {
        usleep((int)pogg_mainloop::wait_time * 1000);
      }
      if (vorbis._3788_4_ == 0) {
        iVar3 = pogg_mainloop::count + 1;
        iVar6 = pogg_mainloop::count % 10;
        pogg_mainloop::count = iVar3;
        if (iVar6 == 0) {
          if (vorbis.file.offset == 0) {
            fprintf(_stderr,"\r%02ld:%02ld %ld %3ldkbit/s %4ldb ",uVar4 / 60000,
                    (uVar4 / 1000) % 0x3c,vorbis.file._0_8_,vorbis.bitrate_maximum / 1000,
                    page.lacing_values._247_8_);
          }
          else {
            local_1098 = (float)uVar4;
            local_10cc = (float)(ulong)vorbis.file._0_8_;
            local_10e8 = (float)vorbis.file.offset;
            lVar5 = (long)((local_1098 / (local_10cc + 1.0)) * local_10e8);
            fprintf(_stderr,"\r%02ld:%02ld/%02ld:%02ld %7ld/%7ld (%3ld%%) %3ldkbit/s %4ldb ",
                    (uVar4 / 1000) / 0x3c,(uVar4 / 1000) % 0x3c,lVar5 / 60000,(lVar5 / 1000) % 0x3c,
                    vorbis.file._0_8_,vorbis.file.offset,(long)((local_10cc * 100.0) / local_10e8),
                    vorbis.bitrate_maximum / 1000,page.lacing_values._247_8_);
          }
        }
        fflush(_stderr);
      }
      gettimeofday((timeval *)&start_sec,(__timezone_ptr_t)0x0);
      pogg_mainloop::wait_time =
           pogg_mainloop::wait_time -
           ((start_sec - uVar1) * 1000 + (ulong)(tv.tv_sec - _Var2) / 1000);
      iVar3 = (int)pogg_mainloop::wait_time;
      if (iVar3 < 1) {
        iVar3 = -iVar3;
      }
      last_time = uVar4;
      if (1000 < iVar3) {
        pogg_mainloop::wait_time = 0;
      }
    }
    iVar3 = file_close((file_t *)&vorbis.blocksize_0);
    if (iVar3 == 0) {
      fprintf(_stderr,"Could not close ogg file %s\n",filename);
      vorbis_stream_destroy((vorbis_stream_t *)&page_time);
      ogg_page_destroy((ogg_page_t *)&tv.tv_usec);
      server_local._4_4_ = 0;
    }
    else {
      vorbis_stream_destroy((vorbis_stream_t *)&page_time);
      ogg_page_destroy((ogg_page_t *)&tv.tv_usec);
      server_local._4_4_ = 1;
    }
  }
  return server_local._4_4_;
}

Assistant:

int pogg_mainloop(http_server_t *server, char *filename, int quiet) {
  /*M
    Open file for reading.
  **/
  vorbis_stream_t vorbis;
  vorbis_stream_init(&vorbis);

  if (!file_open_read(&vorbis.file, filename) ||
      !vorbis_stream_read_hdrs(&vorbis)) {
    fprintf(stderr, "Could not open ogg file: %s\n", filename);
    vorbis_stream_destroy(&vorbis);
    return 0;
  }

  if (!quiet)
    fprintf(stderr, "\rStreaming %s...\n", filename);

  static long wait_time = 0;
  unsigned long page_time = 0, last_time = 0;

  ogg_page_t page;
  ogg_page_init(&page);

  /*M
    Cycle through the frames and send them using HTTP.
  **/
  while ((ogg_next_page(&vorbis.file, &page) >= 0) && !finished) {
    /*M
      Get start time for this page iteration.
    **/
    struct timeval tv;
    gettimeofday(&tv, NULL);
    unsigned long start_sec, start_usec;
    start_sec = tv.tv_sec;
    start_usec = tv.tv_usec;

    /*M
      Go through HTTP main routine and check for timeouts,
      received data, etc...
    **/
    if (!http_server_main(server, &vorbis)) {
      fprintf(stderr, "Http main error\n");
      file_close(&vorbis.file);
      vorbis_stream_destroy(&vorbis);
      ogg_page_destroy(&page);
      return 0;
    }

    /*M
      Write frame to HTTP clients.
    **/
    int i;
    for (i = 0; i < server->num_clients; i++) {
      if ((server->clients[i].fd != -1) &&
          (server->clients[i].found >= 2)) {
        int ret;

        ret = unix_write(server->clients[i].fd, page.raw.data, page.size);

        if (ret != page.size) {
          fprintf(stderr, "Error writing to client %d\n", i);
          http_client_close(server, server->clients + i);
        }
      }
    }
    last_time = page_time;
    page_time = ogg_position_to_msecs(&page, vorbis.audio_sample_rate);
    wait_time += page_time - last_time;

    /*M
      Sleep for duration of frame.
    **/
    if (wait_time > 200)
      usleep((wait_time) * 1000);

    /*M
      Print information.
    **/
    if (!quiet) {
      static int count = 0;
      if ((count++ % 10) == 0) {
        if (vorbis.file.size > 0) {
          fprintf(stderr,
                  "\r%02ld:%02ld/%02ld:%02ld %7ld/%7ld "
                  "(%3ld%%) %3ldkbit/s %4ldb ",
                  (page_time / 1000) / 60,
                  (page_time / 1000) % 60,
                  (long) ((float) (page_time) /
                          ((float) vorbis.file.offset + 1) *
                          (float) vorbis.file.size) /
                  60000,
                  (long) ((float) (page_time) /
                          ((float) vorbis.file.offset + 1) *
                          (float) vorbis.file.size) /
                  1000 % 60,
                  vorbis.file.offset,
                  vorbis.file.size,
                  (long) (100 * (float) vorbis.file.offset / (float) vorbis.file.size),
                  vorbis.bitrate_nominal / 1000,
                  page.size);
        } else {
          fprintf(stderr, "\r%02ld:%02ld %ld %3ldkbit/s %4ldb ",
                  (page_time / 1000) / 60,
                  (page_time / 1000) % 60,
                  vorbis.file.offset,
                  vorbis.bitrate_nominal / 1000,
                  page.size);
        }
      }
      fflush(stderr);
    }

    /*M
      Get length of iteration.
    **/
    gettimeofday(&tv, NULL);
    unsigned long len =
        (tv.tv_sec - start_sec) * 1000 + (tv.tv_usec - start_usec) / 1000;

    wait_time -= len;
    if (abs((int)wait_time) > MAX_WAIT_TIME)
      wait_time = 0;
  }

  if (!file_close(&vorbis.file)) {
    fprintf(stderr, "Could not close ogg file %s\n", filename);
    vorbis_stream_destroy(&vorbis);
    ogg_page_destroy(&page);
    return 0;
  }

  vorbis_stream_destroy(&vorbis);
  ogg_page_destroy(&page);

  return 1;
}